

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::unsetCursor(QWidget *this)

{
  QWidgetPrivate *this_00;
  QWExtra *pQVar1;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar1 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar1 != (QWExtra *)0x0) {
    std::__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_>::reset
              ((__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> *)&pQVar1->curs,(pointer)0x0
              );
  }
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    setAttribute(this,WA_SetCursor,false);
  }
  QWidgetPrivate::unsetCursor_sys(this_00);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_28,CursorChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_28);
  QEvent::~QEvent((QEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::unsetCursor()
{
    Q_D(QWidget);
    if (d->extra)
        d->extra->curs.reset();
    if (!isWindow())
        setAttribute(Qt::WA_SetCursor, false);
    d->unsetCursor_sys();

    QEvent event(QEvent::CursorChange);
    QCoreApplication::sendEvent(this, &event);
}